

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_test.cc
# Opt level: O0

void __thiscall UnitTest_TestQiniuMacAuthV2_Test::TestBody(UnitTest_TestQiniuMacAuthV2_Test *this)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  AssertHelper local_270;
  Message local_268;
  anon_enum_32 local_260;
  Qiniu_Bool local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_10;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_210;
  Message local_208;
  anon_enum_32 local_200;
  Qiniu_Bool local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_8;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_1b0;
  Message local_1a8;
  anon_enum_32 local_1a0;
  Qiniu_Bool local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_6;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_150;
  Message local_148;
  anon_enum_32 local_140;
  Qiniu_Bool local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_f0;
  Message local_e8;
  anon_enum_32 local_e0;
  Qiniu_Bool local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  anon_enum_32 local_b8;
  Qiniu_Bool local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  char *body;
  Qiniu_Header *header;
  Qiniu_Error err;
  Qiniu_Auth auth;
  Qiniu_Mac mac;
  UnitTest_TestQiniuMacAuthV2_Test *this_local;
  
  auth.itbl = (Qiniu_Auth_Itbl *)anon_var_dwarf_1fae;
  join_0x00000010_0x00000000_ = Qiniu_MacAuth((Qiniu_Mac *)&auth.itbl);
  body = (char *)0x0;
  body = (char *)curl_slist_append(0,"X-Qiniu-: a");
  body = (char *)curl_slist_append(body,"X-Qiniu: b");
  body = (char *)curl_slist_append(body,"Content-Type: application/x-www-form-urlencoded");
  Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
  pcVar1 = *(code **)((long)auth.self + 0x10);
  sVar3 = strlen("{\"name\": \"test\"}");
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*pcVar1)(&auth.itbl,"GET",&body,"http://upload.qiniup.com/","{\"name\": \"test\"}",sVar3);
  header = (Qiniu_Header *)
           CONCAT44(gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_4_);
  local_7c = 200;
  err._0_8_ = extraout_RDX;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_78,"err.code","200",(int *)&header,&local_7c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x1e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b4 = match_header_prefix((Qiniu_Header *)body,"Authorization: Qiniu ak:");
  local_b8 = CURLE_UNSUPPORTED_PROTOCOL;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_qiniu[P]c_sdk_gtests____qiniu_base_h:89:2),_nullptr>
            ((EqHelper *)local_b0,"match_header_prefix(header, \"Authorization: Qiniu ak:\")",
             "Qiniu_True",&local_b4,&local_b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x1f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_dc = match_header_prefix((Qiniu_Header *)body,"X-Qiniu-Date:");
  local_e0 = CURLE_UNSUPPORTED_PROTOCOL;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_qiniu[P]c_sdk_gtests____qiniu_base_h:89:2),_nullptr>
            ((EqHelper *)local_d8,"match_header_prefix(header, \"X-Qiniu-Date:\")","Qiniu_True",
             &local_dc,&local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x20,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  curl_slist_free_all(body);
  body = (char *)0x0;
  Qiniu_MacAuth_Disable_Qiniu_Timestamp_Signature();
  pcVar1 = *(code **)((long)auth.self + 0x10);
  sVar3 = strlen("{\"name\": \"test\"}");
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*pcVar1)(&auth.itbl,"GET",&body,"http://upload.qiniup.com/","{\"name\": \"test\"}",sVar3);
  header = (Qiniu_Header *)
           CONCAT44(gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
                    gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_4_);
  err._0_8_ = extraout_RDX_00;
  Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
  local_114 = 200;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_110,"err.code","200",(int *)&header,&local_114);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_13c = match_header_prefix((Qiniu_Header *)body,"X-Qiniu-Date:");
  local_140 = CURLE_OK;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_qiniu[P]c_sdk_gtests____qiniu_base_h:89:2),_nullptr>
            ((EqHelper *)local_138,"match_header_prefix(header, \"X-Qiniu-Date:\")","Qiniu_False",
             &local_13c,&local_140);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(&local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x28,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  curl_slist_free_all(body);
  body = (char *)0x0;
  pcVar1 = *(code **)((long)auth.self + 0x10);
  sVar3 = strlen("{\"name\": \"test\"}");
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*pcVar1)(&auth.itbl,"GET",&body,"http://upload.qiniup.com/","{\"name\": \"test\"}",sVar3);
  header = (Qiniu_Header *)
           CONCAT44(gtest_ar_5.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
                    gtest_ar_5.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_4_);
  local_174 = 200;
  err._0_8_ = extraout_RDX_01;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_170,"err.code","200",(int *)&header,&local_174);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x2d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_19c = match_header_prefix((Qiniu_Header *)body,"X-Qiniu-Date:");
  local_1a0 = CURLE_UNSUPPORTED_PROTOCOL;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_qiniu[P]c_sdk_gtests____qiniu_base_h:89:2),_nullptr>
            ((EqHelper *)local_198,"match_header_prefix(header, \"X-Qiniu-Date:\")","Qiniu_True",
             &local_19c,&local_1a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x2e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  curl_slist_free_all(body);
  body = (char *)0x0;
  body = (char *)curl_slist_append(0,"X-Qiniu-Aaa: CCC");
  body = (char *)curl_slist_append(body,"X-Qiniu-Bbb: AAA");
  body = (char *)curl_slist_append(body,"X-Qiniu-Bbb: BBB");
  body = (char *)curl_slist_append(body,"X-Qiniu-Aaa: DDD");
  Qiniu_MacAuth_Disable_Qiniu_Timestamp_Signature();
  pcVar1 = *(code **)((long)auth.self + 0x10);
  sVar3 = strlen("name=test&language=go}");
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*pcVar1)(&auth.itbl,"GET",&body,"http://upload.qiniup.com/mkfile/sdf.jpg",
                 "name=test&language=go}",sVar3);
  header = (Qiniu_Header *)
           CONCAT44(gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
                    gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_4_);
  err._0_8_ = extraout_RDX_02;
  Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
  local_1d4 = 200;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d0,"err.code","200",(int *)&header,&local_1d4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x3a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  match_header_prefix((Qiniu_Header *)body,"Authorization: Qiniu ak:K8d62cW_hqjxQ3RElNz8g3BQHa8=");
  local_1fc = match_header_prefix((Qiniu_Header *)body,"X-Qiniu-Date:");
  local_200 = CURLE_OK;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_qiniu[P]c_sdk_gtests____qiniu_base_h:89:2),_nullptr>
            ((EqHelper *)local_1f8,"match_header_prefix(header, \"X-Qiniu-Date:\")","Qiniu_False",
             &local_1fc,&local_200);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x3c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  Qiniu_MacAuth_Disable_Qiniu_Timestamp_Signature();
  pcVar1 = *(code **)((long)auth.self + 0x10);
  sVar3 = strlen("name=test&language=go}");
  gtest_ar_9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       (*pcVar1)(&auth.itbl,"GET",&body,"http://upload.qiniup.com/mkfile/sdf.jpg?s=er3&df",
                 "name=test&language=go}",sVar3);
  header = (Qiniu_Header *)
           CONCAT44(gtest_ar_9.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_,
                    gtest_ar_9.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_4_);
  err._0_8_ = extraout_RDX_03;
  Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
  local_234 = 200;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_230,"err.code","200",(int *)&header,&local_234);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_240);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x41,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  match_header_prefix((Qiniu_Header *)body,"Authorization: Qiniu ak:CzOiB_NSxrvMLkhK8hhV_1vTqYk=");
  local_25c = match_header_prefix((Qiniu_Header *)body,"X-Qiniu-Date:");
  local_260 = CURLE_OK;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_qiniu[P]c_sdk_gtests____qiniu_base_h:89:2),_nullptr>
            ((EqHelper *)local_258,"match_header_prefix(header, \"X-Qiniu-Date:\")","Qiniu_False",
             &local_25c,&local_260);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(&local_268);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/auth_test.cc"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  curl_slist_free_all(body);
  return;
}

Assistant:

TEST(UnitTest, TestQiniuMacAuthV2)
{
    Qiniu_Mac mac = {"ak", "sk"};
    Qiniu_Auth auth = Qiniu_MacAuth(&mac);
    Qiniu_Error err;
    Qiniu_Header *header = NULL;
    header = curl_slist_append(header, "X-Qiniu-: a");
    header = curl_slist_append(header, "X-Qiniu: b");
    header = curl_slist_append(header, "Content-Type: application/x-www-form-urlencoded");
    const char *body = "{\"name\": \"test\"}";
    Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
    err = auth.itbl->AuthV2(&mac, "GET", &header, "http://upload.qiniup.com/", body, strlen(body));
    EXPECT_EQ(err.code, 200);
    EXPECT_EQ(match_header_prefix(header, "Authorization: Qiniu ak:"), Qiniu_True);
    EXPECT_EQ(match_header_prefix(header, "X-Qiniu-Date:"), Qiniu_True);
    curl_slist_free_all(header);

    header = NULL;
    Qiniu_MacAuth_Disable_Qiniu_Timestamp_Signature();
    err = auth.itbl->AuthV2(&mac, "GET", &header, "http://upload.qiniup.com/", body, strlen(body));
    Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
    EXPECT_EQ(err.code, 200);
    EXPECT_EQ(match_header_prefix(header, "X-Qiniu-Date:"), Qiniu_False);
    curl_slist_free_all(header);

    header = NULL;
    err = auth.itbl->AuthV2(&mac, "GET", &header, "http://upload.qiniup.com/", body, strlen(body));
    EXPECT_EQ(err.code, 200);
    EXPECT_EQ(match_header_prefix(header, "X-Qiniu-Date:"), Qiniu_True);
    curl_slist_free_all(header);

    header = NULL;
    header = curl_slist_append(header, "X-Qiniu-Aaa: CCC");
    header = curl_slist_append(header, "X-Qiniu-Bbb: AAA");
    header = curl_slist_append(header, "X-Qiniu-Bbb: BBB");
    header = curl_slist_append(header, "X-Qiniu-Aaa: DDD");
    body = "name=test&language=go}";
    Qiniu_MacAuth_Disable_Qiniu_Timestamp_Signature();
    err = auth.itbl->AuthV2(&mac, "GET", &header, "http://upload.qiniup.com/mkfile/sdf.jpg", body, strlen(body));
    Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
    EXPECT_EQ(err.code, 200);
    match_header_prefix(header, "Authorization: Qiniu ak:K8d62cW_hqjxQ3RElNz8g3BQHa8=");
    EXPECT_EQ(match_header_prefix(header, "X-Qiniu-Date:"), Qiniu_False);

    Qiniu_MacAuth_Disable_Qiniu_Timestamp_Signature();
    err = auth.itbl->AuthV2(&mac, "GET", &header, "http://upload.qiniup.com/mkfile/sdf.jpg?s=er3&df", body, strlen(body));
    Qiniu_MacAuth_Enable_Qiniu_Timestamp_Signature();
    EXPECT_EQ(err.code, 200);
    match_header_prefix(header, "Authorization: Qiniu ak:CzOiB_NSxrvMLkhK8hhV_1vTqYk=");
    EXPECT_EQ(match_header_prefix(header, "X-Qiniu-Date:"), Qiniu_False);
    curl_slist_free_all(header);
}